

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O3

string_view __thiscall slang::ast::Definition::getKindString(Definition *this)

{
  DefinitionKind DVar1;
  size_t sVar2;
  logic_error *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  char *pcVar6;
  string_view sVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  DVar1 = this->definitionKind;
  if (DVar1 == Module) {
    pcVar6 = "module";
    sVar2 = 6;
  }
  else if (DVar1 == Program) {
    pcVar6 = "program";
    sVar2 = 7;
  }
  else {
    if (DVar1 != Interface) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Definition.cpp"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
        local_b0.field_2._M_allocated_capacity = *psVar4;
        local_b0.field_2._8_8_ = plVar3[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar4;
      }
      local_b0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x9f);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_90 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_f0 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pcVar6 = "interface";
    sVar2 = 9;
  }
  sVar7._M_str = pcVar6;
  sVar7._M_len = sVar2;
  return sVar7;
}

Assistant:

string_view Definition::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
        default:
            ASSUME_UNREACHABLE;
    }
}